

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O0

int mbedtls_x509_write_sig(uchar **p,uchar *start,char *oid,size_t oid_len,uchar *sig,size_t size)

{
  uchar *puVar1;
  int iVar2;
  size_t len;
  int ret;
  size_t size_local;
  uchar *sig_local;
  size_t oid_len_local;
  char *oid_local;
  uchar *start_local;
  uchar **p_local;
  
  if ((*p < start) || ((ulong)((long)*p - (long)start) < size)) {
    p_local._4_4_ = -0x6c;
  }
  else {
    *p = *p + -size;
    memcpy(*p,sig,size);
    if ((long)*p - (long)start < 1) {
      p_local._4_4_ = -0x6c;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      p_local._4_4_ = mbedtls_asn1_write_len(p,start,size + 1);
      if (-1 < p_local._4_4_) {
        iVar2 = p_local._4_4_ + (int)(size + 1);
        p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x03');
        if (-1 < p_local._4_4_) {
          iVar2 = p_local._4_4_ + iVar2;
          p_local._4_4_ = mbedtls_asn1_write_algorithm_identifier(p,start,oid,oid_len,0);
          if (-1 < p_local._4_4_) {
            p_local._4_4_ = p_local._4_4_ + iVar2;
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_write_sig( unsigned char **p, unsigned char *start,
                    const char *oid, size_t oid_len,
                    unsigned char *sig, size_t size )
{
    int ret;
    size_t len = 0;

    if( *p < start || (size_t)( *p - start ) < size )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = size;
    (*p) -= len;
    memcpy( *p, sig, len );

    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *--(*p) = 0;
    len += 1;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    // Write OID
    //
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( p, start, oid,
                                                        oid_len, 0 ) );

    return( (int) len );
}